

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::useActiveException(ResultBuilder *this,Flags resultDisposition)

{
  string asStack_38 [32];
  
  (this->m_assertionInfo).resultDisposition = resultDisposition;
  translateActiveException_abi_cxx11_();
  std::operator<<((ostream *)&this->m_stream,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  (this->m_data).resultType = ThrewException;
  captureExpression(this);
  return;
}

Assistant:

void ResultBuilder::useActiveException( ResultDisposition::Flags resultDisposition ) {
        m_assertionInfo.resultDisposition = resultDisposition;
        m_stream.oss << Catch::translateActiveException();
        captureResult( ResultWas::ThrewException );
    }